

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QDateTime __thiscall QDate::startOfDay(QDate *this,QTimeZone *zone)

{
  StatusFlags *pSVar1;
  QTimeZonePrivate *pQVar2;
  bool bVar3;
  Data DVar4;
  QDate QVar5;
  QTimeZone *in_RDX;
  undefined1 *puVar6;
  long in_FS_OFFSET;
  QDateTime when;
  OffsetData tran;
  QTime local_84;
  Data local_80;
  QTime local_74;
  Data local_70;
  Data local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  Data DStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1 *)0x31b5d43afe < (undefined1 *)((long)&(zone->d).d[0x9f11b8cc].m_id.d.d + 3U)) ||
     (bVar3 = QTimeZone::isValid(in_RDX), !bVar3)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QDateTime::QDateTime((QDateTime *)this);
      return (QDateTime)(Data)this;
    }
    goto LAB_0034b9b6;
  }
  local_70.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QVar5.jd = *(qint64 *)&(zone->d).s;
  QTime::QTime(&local_74,0,0,0,0);
  QDateTime::QDateTime((QDateTime *)&local_70.data,QVar5,local_74,in_RDX,LegacyBehavior);
  DVar4 = local_70;
  if (((ulong)local_70.d & 1) == 0) {
    DVar4._4_4_ = 0;
    DVar4._0_4_ = ((local_70.d)->m_status).
                  super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                  super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  if ((((ulong)DVar4.d & 8) == 0) ||
     (QVar5 = QDateTime::date((QDateTime *)&local_70.data),
     (QTimeZonePrivate *)QVar5.jd != (zone->d).d)) {
    if (((-*(int *)&in_RDX->d & 3U) != 0) || (bVar3 = QTimeZone::hasTransitions(in_RDX), !bVar3)) {
LAB_0034b92c:
      toEarliest((QDate)&local_68,(QTimeZone *)(zone->d).d);
      DVar4 = local_70;
      local_70 = local_68;
      local_68.d = DVar4.d;
      QDateTime::~QDateTime((QDateTime *)&local_68.data);
      goto LAB_0034b7a8;
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    DStack_50.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (zone->d).d;
    QVar5.jd = -0x8000000000000000;
    if ((undefined1 *)0xfffffe92c1eb868b <
        (undefined1 *)((long)&pQVar2[-0x490c75003].m_id.d.size + 3U)) {
      puVar6 = (undefined1 *)((long)&pQVar2->_vptr_QTimeZonePrivate + 1);
      if ((undefined1 *)((long)&pQVar2[-0x490c75003].m_id.d.size + 4U) <
          (undefined1 *)0xfffffe92c1eb868c) {
        puVar6 = (undefined1 *)0x8000000000000000;
      }
      if (!SCARRY8((long)pQVar2,1)) {
        QVar5.jd = (qint64)puVar6;
      }
    }
    QTime::QTime(&local_84,0xc,0,0,0);
    QDateTime::QDateTime((QDateTime *)&local_80.data,QVar5,local_84,in_RDX,LegacyBehavior);
    QTimeZone::previousTransition((OffsetData *)&local_68.data,in_RDX,(QDateTime *)&local_80.data);
    QDateTime::~QDateTime((QDateTime *)&local_80.data);
    QDateTime::toTimeZone((QDateTime *)&local_80.data,(QTimeZone *)&DStack_50.s);
    if (((ulong)local_80.d & 1) == 0) {
      pSVar1 = &(local_80.d)->m_status;
      local_80._4_4_ = 0;
      local_80._0_4_ =
           (pSVar1->super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>).
           super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    if ((((ulong)local_80.d & 8) == 0) ||
       (QVar5 = QDateTime::date((QDateTime *)&local_80.data),
       (QTimeZonePrivate *)QVar5.jd != (zone->d).d)) {
      QDateTime::~QDateTime((QDateTime *)&local_80.data);
      QTimeZone::OffsetData::~OffsetData((OffsetData *)&local_68.data);
      goto LAB_0034b92c;
    }
    QDateTime::QDateTime((QDateTime *)this,(QDateTime *)&local_80.data);
    QDateTime::~QDateTime((QDateTime *)&local_80.data);
    QTimeZone::OffsetData::~OffsetData((OffsetData *)&local_68.data);
  }
  else {
LAB_0034b7a8:
    QDateTime::QDateTime((QDateTime *)this,(QDateTime *)&local_70.data);
  }
  QDateTime::~QDateTime((QDateTime *)&local_70.data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDateTime)(Data)this;
  }
LAB_0034b9b6:
  __stack_chk_fail();
}

Assistant:

QDateTime QDate::startOfDay(const QTimeZone &zone) const
{
    if (!inDateTimeRange(jd, DaySide::Start) || !zone.isValid())
        return QDateTime();

    QDateTime when(*this, QTime(0, 0), zone,
                   QDateTime::TransitionResolution::RelativeToBefore);
    if (Q_UNLIKELY(!when.isValid() || when.date() != *this)) {
#if QT_CONFIG(timezone)
        // The start of the day must have fallen in a spring-forward's gap; find the spring-forward:
        if (zone.timeSpec() == Qt::TimeZone && zone.hasTransitions()) {
            QTimeZone::OffsetData tran
                // There's unlikely to be another transition before noon tomorrow.
                // However, the whole of today may have been skipped !
                = zone.previousTransition(QDateTime(addDays(1), QTime(12, 0), zone));
            const QDateTime &at = tran.atUtc.toTimeZone(zone);
            if (at.isValid() && at.date() == *this)
                return at;
        }
#endif

        when = toEarliest(*this, zone);
    }

    return when;
}